

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O2

void TasGrid::HierarchyManipulations::completeToLower<(TasGrid::RuleLocal::erule)1>
               (MultiIndexSet *mset,MultiIndexSet *refined)

{
  uint uVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  int *p;
  pointer piVar5;
  int *__first;
  int iVar6;
  ulong uVar7;
  allocator_type local_a1;
  unsigned_long local_a0;
  ulong local_98;
  ulong local_90;
  MultiIndexSet *local_88;
  vector<int,_std::allocator<int>_> parent;
  Data2D<int> addons;
  
  local_a0 = mset->num_dimensions;
  iVar6 = 1;
  local_88 = mset;
  while (iVar6 != 0) {
    Data2D<int>::Data2D<unsigned_long,int>(&addons,local_a0,0);
    uVar1 = refined->cache_num_indexes;
    if (refined->cache_num_indexes < 1) {
      uVar1 = 0;
    }
    local_98 = (ulong)uVar1;
    uVar7 = 0;
    while (iVar6 = (int)addons.num_strips, uVar7 != local_98) {
      __first = (refined->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + refined->num_dimensions * uVar7;
      ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
                ((vector<int,std::allocator<int>> *)&parent,__first,__first + local_a0,&local_a1);
      piVar2 = parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      local_90 = uVar7;
      for (piVar5 = parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
        iVar6 = *piVar5;
        iVar4 = (iVar6 + 1) / 2 - (uint)(iVar6 < 4);
        *piVar5 = iVar4;
        if (iVar4 != -1) {
          bVar3 = MultiIndexSet::missing(refined,&parent);
          if (bVar3) {
            bVar3 = MultiIndexSet::missing(local_88,&parent);
            if (bVar3) {
              Data2D<int>::appendStrip(&addons,&parent);
            }
          }
        }
        *piVar5 = iVar6;
      }
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&parent);
      uVar7 = local_90 + 1;
    }
    if ((int)addons.num_strips != 0) {
      MultiIndexSet::MultiIndexSet((MultiIndexSet *)&parent,&addons);
      MultiIndexSet::operator+=(refined,(MultiIndexSet *)&parent);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)
                 &parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&addons.vec.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void completeToLower(MultiIndexSet const &mset, MultiIndexSet &refined){
    size_t num_dimensions = mset.getNumDimensions();
    size_t num_added = 1; // set to 1 to start the loop
    while(num_added > 0){
        Data2D<int> addons(num_dimensions, 0);
        int num_points = refined.getNumIndexes();

        for(int i=0; i<num_points; i++){
            std::vector<int> parent(refined.getIndex(i), refined.getIndex(i) + num_dimensions);
            for(auto &p : parent){
                int r = p;
                p = RuleLocal::getParent<effrule>(r);
                if ((p != -1) && refined.missing(parent) && mset.missing(parent))
                    addons.appendStrip(parent);
                p = RuleLocal::getStepParent<effrule>(r);
                if ((p != -1) && refined.missing(parent) && mset.missing(parent))
                    addons.appendStrip(parent);
                p = r;
            }
        }

        num_added = addons.getNumStrips();
        if (num_added > 0) refined += addons;
    }
}